

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

void __thiscall OpenMD::SimInfo::setupSimVariables(SimInfo *this)

{
  bool bVar1;
  long in_RDI;
  bool usesFluctuatingCharges;
  bool usesDirectional;
  bool usesMetallic;
  bool usesElectrostatic;
  AtomTypeSet atomTypes;
  iterator i;
  set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
  *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff64;
  undefined1 in_stack_ffffffffffffff65;
  undefined1 in_stack_ffffffffffffff66;
  undefined1 in_stack_ffffffffffffff67;
  _Self local_90;
  _Base_ptr local_88;
  byte local_80;
  byte local_7f;
  byte local_7e;
  byte local_7d;
  AtomType *in_stack_ffffffffffffffa0;
  SimInfo *in_stack_ffffffffffffffe8;
  _Rb_tree_const_iterator<OpenMD::AtomType_*> local_10 [2];
  
  bVar1 = Globals::getUseAtomicVirial((Globals *)0x139325);
  *(bool *)(in_RDI + 0x4b3) = bVar1;
  *(undefined1 *)(in_RDI + 0x4b1) = 0;
  bVar1 = Globals::haveAccumulateBoxDipole((Globals *)0x139345);
  if ((bVar1) && (bVar1 = Globals::getAccumulateBoxDipole((Globals *)0x139359), bVar1)) {
    *(undefined1 *)(in_RDI + 0x4b1) = 1;
  }
  *(undefined1 *)(in_RDI + 0x4b2) = 0;
  bVar1 = Globals::haveAccumulateBoxQuadrupole((Globals *)0x139382);
  if ((bVar1) && (bVar1 = Globals::getAccumulateBoxQuadrupole((Globals *)0x139396), bVar1)) {
    *(undefined1 *)(in_RDI + 0x4b2) = 1;
  }
  std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::_Rb_tree_const_iterator(local_10);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x1393c1);
  getSimulatedAtomTypes(in_stack_ffffffffffffffe8);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
  operator=((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_> *
            )CONCAT17(in_stack_ffffffffffffff67,
                      CONCAT16(in_stack_ffffffffffffff66,
                               CONCAT15(in_stack_ffffffffffffff65,
                                        CONCAT14(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60
                                                )))),in_stack_ffffffffffffff58);
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x1393eb);
  local_7d = 0;
  local_7e = 0;
  local_7f = 0;
  local_80 = 0;
  local_88 = (_Base_ptr)
             std::
             set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::
             begin(in_stack_ffffffffffffff58);
  local_10[0]._M_node = local_88;
  while( true ) {
    local_90._M_node =
         (_Base_ptr)
         std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
         ::end(in_stack_ffffffffffffff58);
    bVar1 = std::operator!=(local_10,&local_90);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60)))));
    in_stack_ffffffffffffff67 =
         AtomType::isElectrostatic
                   ((AtomType *)
                    CONCAT17(in_stack_ffffffffffffff67,
                             CONCAT16(in_stack_ffffffffffffff66,
                                      CONCAT15(in_stack_ffffffffffffff65,
                                               CONCAT14(in_stack_ffffffffffffff64,
                                                        in_stack_ffffffffffffff60)))));
    local_7d = local_7d & 1 | in_stack_ffffffffffffff67;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60)))));
    in_stack_ffffffffffffff66 =
         AtomType::isMetal((AtomType *)
                           CONCAT17(in_stack_ffffffffffffff67,
                                    CONCAT16(in_stack_ffffffffffffff66,
                                             CONCAT15(in_stack_ffffffffffffff65,
                                                      CONCAT14(in_stack_ffffffffffffff64,
                                                               in_stack_ffffffffffffff60)))));
    local_7e = local_7e & 1 | in_stack_ffffffffffffff66;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60)))));
    in_stack_ffffffffffffff65 = AtomType::isDirectional(in_stack_ffffffffffffffa0);
    local_7f = local_7f & 1 | in_stack_ffffffffffffff65;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator*
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60)))));
    in_stack_ffffffffffffff64 = AtomType::isFluctuatingCharge(in_stack_ffffffffffffffa0);
    local_80 = (local_80 & 1) != 0 || (bool)in_stack_ffffffffffffff64;
    std::_Rb_tree_const_iterator<OpenMD::AtomType_*>::operator++
              ((_Rb_tree_const_iterator<OpenMD::AtomType_*> *)
               CONCAT17(in_stack_ffffffffffffff67,
                        CONCAT16(in_stack_ffffffffffffff66,
                                 CONCAT15(in_stack_ffffffffffffff65,
                                          CONCAT14(in_stack_ffffffffffffff64,
                                                   in_stack_ffffffffffffff60)))));
  }
  *(byte *)(in_RDI + 0x9d) = local_7f & 1;
  *(byte *)(in_RDI + 0x9e) = local_7e & 1;
  *(byte *)(in_RDI + 0x9f) = local_7d & 1;
  *(byte *)(in_RDI + 0xa0) = local_80 & 1;
  *(byte *)(in_RDI + 0xa2) = *(byte *)(in_RDI + 0x9e) & 1;
  *(byte *)(in_RDI + 0xa3) = *(byte *)(in_RDI + 0x9f) & 1;
  *(byte *)(in_RDI + 0xa4) = -(*(byte *)(in_RDI + 0x9f) & 1) & 1;
  std::set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>::~set
            ((set<OpenMD::AtomType_*,_OpenMD::AtomTypeCompare,_std::allocator<OpenMD::AtomType_*>_>
              *)0x1395a2);
  return;
}

Assistant:

void SimInfo::setupSimVariables() {
    useAtomicVirial_ = simParams_->getUseAtomicVirial();
    // we only call setAccumulateBoxDipole if the accumulateBoxDipole
    // parameter is true
    calcBoxDipole_ = false;
    if (simParams_->haveAccumulateBoxDipole())
      if (simParams_->getAccumulateBoxDipole()) { calcBoxDipole_ = true; }
    // we only call setAccumulateBoxQuadrupole if the accumulateBoxQuadrupole
    // parameter is true
    calcBoxQuadrupole_ = false;
    if (simParams_->haveAccumulateBoxQuadrupole())
      if (simParams_->getAccumulateBoxQuadrupole()) {
        calcBoxQuadrupole_ = true;
      }

    AtomTypeSet::iterator i;
    AtomTypeSet atomTypes;
    atomTypes                   = getSimulatedAtomTypes();
    bool usesElectrostatic      = false;
    bool usesMetallic           = false;
    bool usesDirectional        = false;
    bool usesFluctuatingCharges = false;
    // loop over all of the atom types
    for (i = atomTypes.begin(); i != atomTypes.end(); ++i) {
      usesElectrostatic |= (*i)->isElectrostatic();
      usesMetallic |= (*i)->isMetal();
      usesDirectional |= (*i)->isDirectional();
      usesFluctuatingCharges |= (*i)->isFluctuatingCharge();
    }

#ifdef IS_MPI
    int temp;

    temp = usesDirectional;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesDirectionalAtoms_ = (temp == 0) ? false : true;

    temp = usesMetallic;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesMetallicAtoms_ = (temp == 0) ? false : true;

    temp = usesElectrostatic;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesElectrostaticAtoms_ = (temp == 0) ? false : true;

    temp = usesFluctuatingCharges;
    MPI_Allreduce(MPI_IN_PLACE, &temp, 1, MPI_INT, MPI_LOR, MPI_COMM_WORLD);
    usesFluctuatingCharges_ = (temp == 0) ? false : true;
#else

    usesDirectionalAtoms_   = usesDirectional;
    usesMetallicAtoms_      = usesMetallic;
    usesElectrostaticAtoms_ = usesElectrostatic;
    usesFluctuatingCharges_ = usesFluctuatingCharges;

#endif

    requiresPrepair_        = usesMetallicAtoms_ ? true : false;
    requiresSkipCorrection_ = usesElectrostaticAtoms_ ? true : false;
    requiresSelfCorrection_ = usesElectrostaticAtoms_ ? true : false;
  }